

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerBailOnNotObject
          (Lowerer *this,Instr *instr,BranchInstr *branchInstr,LabelInstr *labelBailOut)

{
  Instr *pIVar1;
  LabelInstr *labelTarget;
  Opnd *opndSrc;
  LabelInstr *continueLabelInstr;
  Instr *prevInstr;
  LabelInstr *labelBailOut_local;
  BranchInstr *branchInstr_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar1 = instr->m_prev;
  labelTarget = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::InsertAfter(instr,&labelTarget->super_Instr);
  opndSrc = IR::Instr::UnlinkSrc1(instr);
  LowererMD::GenerateObjectTest(&this->m_lowererMD,opndSrc,instr,labelTarget,true);
  GenerateBailOut(this,instr,branchInstr,labelBailOut,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnNotObject(IR::Instr       *instr,
                              IR::BranchInstr *branchInstr  /* = nullptr */,
                              IR::LabelInstr  *labelBailOut /* = nullptr */)
{
    IR::Instr      *prevInstr          = instr->m_prev;
    IR::LabelInstr *continueLabelInstr = IR::LabelInstr::New(Js::OpCode::Label,
                                                             m_func);
    instr->InsertAfter(continueLabelInstr);
    this->m_lowererMD.GenerateObjectTest(instr->UnlinkSrc1(),
                                         instr,
                                         continueLabelInstr,
                                         /* fContinueLabel = */ true);
    this->GenerateBailOut(instr, branchInstr, labelBailOut);

    return prevInstr;
}